

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O3

TZDBNames * icu_63::TZDBNames::createInstance(UResourceBundle *rb,char *key)

{
  size_t s;
  uint uVar1;
  UResourceBundle *resB;
  UChar **buffer;
  UChar *pUVar2;
  UResourceBundle *resB_00;
  UChar **__s;
  UChar *us;
  TZDBNames *pTVar3;
  char *cs;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  UErrorCode status;
  int32_t len;
  UErrorCode local_40;
  int32_t local_3c;
  ulong local_38;
  
  if (key == (char *)0x0 || rb == (UResourceBundle *)0x0) {
    return (TZDBNames *)0x0;
  }
  if (*key == '\0') {
    return (TZDBNames *)0x0;
  }
  local_40 = U_ZERO_ERROR;
  local_3c = 0;
  resB = ures_getByKey_63(rb,key,(UResourceBundle *)0x0,&local_40);
  if (U_ZERO_ERROR < local_40) {
    return (TZDBNames *)0x0;
  }
  buffer = (UChar **)uprv_malloc_63(0x10);
  if (buffer == (UChar **)0x0) {
    return (TZDBNames *)0x0;
  }
  lVar4 = 0;
  uVar5 = 0;
  do {
    while( true ) {
      local_38 = uVar5;
      local_40 = U_ZERO_ERROR;
      pUVar2 = ures_getStringByKey_63
                         (resB,(char *)((long)&_ZN6icu_63L14TZDBNAMES_KEYSE_rel +
                                       (long)(int)(&_ZN6icu_63L14TZDBNAMES_KEYSE_rel)[lVar4]),
                          &local_3c,&local_40);
      if ((local_40 < U_ILLEGAL_ARGUMENT_ERROR) && (local_3c != 0)) break;
      buffer[lVar4] = (UChar *)0x0;
      bVar6 = lVar4 != 0;
      lVar4 = 1;
      uVar5 = local_38;
      if (bVar6) {
        if ((local_38 & 1) == 0) goto LAB_0020640d;
        goto LAB_002062b5;
      }
    }
    buffer[lVar4] = pUVar2;
    bVar6 = lVar4 == 0;
    lVar4 = 1;
    uVar5 = CONCAT71((int7)((ulong)pUVar2 >> 8),1);
  } while (bVar6);
LAB_002062b5:
  cs = "parseRegions";
  uVar1 = 0;
  resB_00 = ures_getByKey_63(resB,"parseRegions",(UResourceBundle *)0x0,&local_40);
  bVar6 = true;
  if (local_40 < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar1 = ures_getSize_63(resB_00);
    if (0 < (int)uVar1) {
      s = (ulong)uVar1 * 8;
      local_38 = (ulong)uVar1;
      __s = (UChar **)uprv_malloc_63(s);
      if (__s == (UChar **)0x0) {
        __s = (UChar **)0x0;
      }
      else {
        uVar5 = 0;
        memset(__s,0,s);
        do {
          local_40 = U_ZERO_ERROR;
          pUVar2 = (UChar *)(uVar5 & 0xffffffff);
          us = ures_getStringByIndex_63(resB_00,(int32_t)uVar5,&local_3c,&local_40);
          if (U_ZERO_ERROR < local_40) {
LAB_00206393:
            cs = (char *)pUVar2;
            bVar6 = false;
            goto LAB_0020639b;
          }
          cs = (char *)uprv_malloc_63((long)local_3c + 1);
          __s[uVar5] = (UChar *)cs;
          if ((UChar *)cs == (UChar *)0x0) goto LAB_00206393;
          u_UCharsToChars_63(us,cs,local_3c);
          *(undefined1 *)((long)__s[uVar5] + (long)local_3c) = 0;
          uVar5 = uVar5 + 1;
        } while ((int)local_38 != (int)uVar5);
        bVar6 = true;
      }
LAB_0020639b:
      uVar1 = (uint)local_38;
      goto LAB_002063a0;
    }
  }
  __s = (UChar **)0x0;
LAB_002063a0:
  ures_close_63(resB_00);
  ures_close_63(resB);
  if (bVar6) {
    pTVar3 = (TZDBNames *)UMemory::operator_new((UMemory *)0x20,(size_t)cs);
    if (pTVar3 != (TZDBNames *)0x0) {
      pTVar3->_vptr_TZDBNames = (_func_int **)&PTR__TZDBNames_003b02f0;
      pTVar3->fNames = buffer;
      pTVar3->fRegions = (char **)__s;
      pTVar3->fNumRegions = uVar1;
      return pTVar3;
    }
  }
  else {
    uprv_free_63(buffer);
    if (__s != (UChar **)0x0) {
      buffer = __s;
      if (0 < (int)uVar1) {
        lVar4 = 0;
        do {
          uprv_free_63(__s[lVar4]);
          lVar4 = lVar4 + 1;
        } while (uVar1 != (uint)lVar4);
      }
LAB_0020640d:
      uprv_free_63(buffer);
    }
  }
  return (TZDBNames *)0x0;
}

Assistant:

TZDBNames*
TZDBNames::createInstance(UResourceBundle* rb, const char* key) {
    if (rb == NULL || key == NULL || *key == 0) {
        return NULL;
    }

    UErrorCode status = U_ZERO_ERROR;

    const UChar **names = NULL;
    char** regions = NULL;
    int32_t numRegions = 0;

    int32_t len = 0;

    UResourceBundle* rbTable = NULL;
    rbTable = ures_getByKey(rb, key, rbTable, &status);
    if (U_FAILURE(status)) {
        return NULL;
    }

    names = (const UChar **)uprv_malloc(sizeof(const UChar*) * TZDBNAMES_KEYS_SIZE);
    UBool isEmpty = TRUE;
    if (names != NULL) {
        for (int32_t i = 0; i < TZDBNAMES_KEYS_SIZE; i++) {
            status = U_ZERO_ERROR;
            const UChar *value = ures_getStringByKey(rbTable, TZDBNAMES_KEYS[i], &len, &status);
            if (U_FAILURE(status) || len == 0) {
                names[i] = NULL;
            } else {
                names[i] = value;
                isEmpty = FALSE;
            }
        }
    }

    if (isEmpty) {
        if (names != NULL) {
            uprv_free(names);
        }
        return NULL;
    }

    UResourceBundle *regionsRes = ures_getByKey(rbTable, "parseRegions", NULL, &status);
    UBool regionError = FALSE;
    if (U_SUCCESS(status)) {
        numRegions = ures_getSize(regionsRes);
        if (numRegions > 0) {
            regions = (char**)uprv_malloc(sizeof(char*) * numRegions);
            if (regions != NULL) {
                char **pRegion = regions;
                for (int32_t i = 0; i < numRegions; i++, pRegion++) {
                    *pRegion = NULL;
                }
                // filling regions
                pRegion = regions;
                for (int32_t i = 0; i < numRegions; i++, pRegion++) {
                    status = U_ZERO_ERROR;
                    const UChar *uregion = ures_getStringByIndex(regionsRes, i, &len, &status);
                    if (U_FAILURE(status)) {
                        regionError = TRUE;
                        break;
                    }
                    *pRegion = (char*)uprv_malloc(sizeof(char) * (len + 1));
                    if (*pRegion == NULL) {
                        regionError = TRUE;
                        break;
                    }
                    u_UCharsToChars(uregion, *pRegion, len);
                    (*pRegion)[len] = 0;
                }
            }
        }
    }
    ures_close(regionsRes);
    ures_close(rbTable);

    if (regionError) {
        if (names != NULL) {
            uprv_free(names);
        }
        if (regions != NULL) {
            char **p = regions;
            for (int32_t i = 0; i < numRegions; p++, i++) {
                uprv_free(*p);
            }
            uprv_free(regions);
        }
        return NULL;
    }

    return new TZDBNames(names, regions, numRegions);
}